

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t
XXH3_hashLong_64b_withSecret
          (void *input,size_t len,XXH64_hash_t seed64,xxh_u8 *secret,size_t secretLen)

{
  XXH64_hash_t XVar1;
  XXH3_f_scrambleAcc in_stack_00000028;
  XXH3_f_accumulate_512 in_stack_00000030;
  size_t in_stack_00000038;
  void *in_stack_00000040;
  size_t in_stack_00000048;
  void *in_stack_00000050;
  
  XVar1 = XXH3_hashLong_64b_internal
                    (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038,
                     in_stack_00000030,in_stack_00000028);
  return XVar1;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t XXH3_hashLong_64b_withSecret(
    const void* XXH_RESTRICT input, size_t len, XXH64_hash_t seed64,
    const xxh_u8* XXH_RESTRICT secret, size_t secretLen) {
  (void)seed64;
  return XXH3_hashLong_64b_internal(input, len, secret, secretLen,
                                    XXH3_accumulate_512, XXH3_scrambleAcc);
}